

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_volumemeter.c
# Opt level: O2

uint32_t FAudioCreateVolumeMeterWithCustomAllocatorEXT
                   (FAPO **ppApo,uint32_t Flags,FAudioMallocFunc customMalloc,
                   FAudioFreeFunc customFree,FAudioReallocFunc customRealloc)

{
  FAPOBase *fapo;
  uint8_t *pParameterBlocks;
  
  fapo = (FAPOBase *)(*customMalloc)(0xe8);
  pParameterBlocks = (uint8_t *)(*customMalloc)(0x3c);
  SDL_memset(pParameterBlocks,0,0x3c);
  SDL_memcpy(&VolumeMeterProperties,&FAudioFX_CLSID_AudioVolumeMeter,0x10);
  CreateFAPOBaseWithCustomAllocatorEXT
            (fapo,&VolumeMeterProperties,pParameterBlocks,0x14,'\x01',customMalloc,customFree,
             customRealloc);
  (fapo->base).LockForProcess = FAudioFXVolumeMeter_LockForProcess;
  (fapo->base).UnlockForProcess = FAudioFXVolumeMeter_UnlockForProcess;
  (fapo->base).Process = FAudioFXVolumeMeter_Process;
  (fapo->base).GetParameters = FAudioFXVolumeMeter_GetParameters;
  fapo->Destructor = FAudioFXVolumeMeter_Free;
  *ppApo = (FAPO *)fapo;
  return 0;
}

Assistant:

uint32_t FAudioCreateVolumeMeterWithCustomAllocatorEXT(
	FAPO** ppApo,
	uint32_t Flags,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc
) {
	/* Allocate... */
	FAudioFXVolumeMeter *result = (FAudioFXVolumeMeter*) customMalloc(
		sizeof(FAudioFXVolumeMeter)
	);
	uint8_t *params = (uint8_t*) customMalloc(
		sizeof(FAudioFXVolumeMeterLevels) * 3
	);
	FAudio_zero(params, sizeof(FAudioFXVolumeMeterLevels) * 3);

	/* Initialize... */
	FAudio_memcpy(
		&VolumeMeterProperties.clsid,
		&FAudioFX_CLSID_AudioVolumeMeter,
		sizeof(FAudioGUID)
	);
	CreateFAPOBaseWithCustomAllocatorEXT(
		&result->base,
		&VolumeMeterProperties,
		params,
		sizeof(FAudioFXVolumeMeterLevels),
		1,
		customMalloc,
		customFree,
		customRealloc
	);

	/* Function table... */
	result->base.base.LockForProcess = (LockForProcessFunc)
		FAudioFXVolumeMeter_LockForProcess;
	result->base.base.UnlockForProcess = (UnlockForProcessFunc)
		FAudioFXVolumeMeter_UnlockForProcess;
	result->base.base.Process = (ProcessFunc)
		FAudioFXVolumeMeter_Process;
	result->base.base.GetParameters = (GetParametersFunc)
		FAudioFXVolumeMeter_GetParameters;
	result->base.Destructor = FAudioFXVolumeMeter_Free;

	/* Finally. */
	*ppApo = &result->base.base;
	return 0;
}